

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O3

void LoadVertices(Level *NewLev)

{
  Vertex *pVVar1;
  Vertex **ppVVar2;
  
  ppVVar2 = &NewLev->AllVerts;
  ExpectToken(TK_OPENBRACE);
  while( true ) {
    GetToken();
    if (Token.Type != TK_OPENBRACE) break;
    pVVar1 = NewVertex();
    *ppVVar2 = pVVar1;
    ExpectToken(TK_NUMBER);
    (*ppVVar2)->Pos[0] = Token.FQuantity;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    (*ppVVar2)->Pos[1] = Token.FQuantity;
    ExpectToken(TK_CLOSEBRACE);
    ppVVar2 = &(*ppVVar2)->Next;
  }
  if (Token.Type != TK_CLOSEBRACE) {
    Error = 1;
  }
  return;
}

Assistant:

void LoadVertices(struct Level *NewLev)
{
   struct Vertex **NewVertPtr = &NewLev->AllVerts;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               *NewVertPtr = NewVertex();

               ExpectToken(TK_NUMBER);
               (*NewVertPtr)->Pos[0] = Token.FQuantity;

               ExpectToken(TK_COMMA);
               ExpectToken(TK_NUMBER);
               (*NewVertPtr)->Pos[1] = Token.FQuantity;

               ExpectToken(TK_CLOSEBRACE);
               NewVertPtr = &(*NewVertPtr)->Next;
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}